

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

int __thiscall Expr::MinimalHeaderSize(Expr *this,Env *env)

{
  bool bVar1;
  uint h2;
  int iVar2;
  undefined4 extraout_var;
  Object *o;
  RecordField *this_00;
  size_type sVar3;
  reference ppCVar4;
  char *pcVar5;
  ulong uVar6;
  vector<Expr_*,_std::allocator<Expr_*>_> *pvVar7;
  int __c;
  int __c_00;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  Expr *in_RSI;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i_2;
  uint j;
  CaseExpr *ce;
  uint i_1;
  uint i;
  RecordField *prev_field;
  RecordField *field;
  ID *id_1;
  Expr *in_stack_00000088;
  Type *ty;
  RecordField *rf;
  ID *id;
  int elem_size;
  Type *elem_type;
  Type *array_type;
  int index;
  int mhs;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ID *in_stack_ffffffffffffff08;
  Env *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  ID *in_stack_ffffffffffffff28;
  Env *in_stack_ffffffffffffff30;
  ID *__a;
  int local_b0;
  uint local_ac;
  Env *in_stack_ffffffffffffff58;
  CaseExpr *this_01;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff64;
  char local_69 [33];
  Type *local_48;
  RecordField *local_40;
  ID *local_38;
  int local_2c;
  long *local_28;
  Type *local_20;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar10;
  
  switch(*(undefined4 *)((long)&in_RDI[2].field_2 + 8)) {
  case 0:
    iVar10 = anon_unknown.dwarf_7075e::mhs_id(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    break;
  case 1:
    iVar10 = 0;
    break;
  default:
    iVar10 = 0;
    for (local_b0 = 0; local_b0 < 3; local_b0 = local_b0 + 1) {
      if (*(long *)(&in_RDI[3]._M_dataplus + (long)local_b0 * 8) != 0) {
        iVar2 = MinimalHeaderSize(in_RSI,(Env *)CONCAT44(iVar10,in_stack_ffffffffffffffe8));
        iVar10 = anon_unknown.dwarf_7075e::mhs_max(iVar10,iVar2);
      }
    }
    break;
  case 4:
    local_20 = DataType(in_stack_00000088,(Env *)id_1);
    iVar10 = (*(local_20->super_DataDepElement)._vptr_DataDepElement[0xe])();
    local_28 = (long *)CONCAT44(extraout_var,iVar10);
    local_2c = (**(code **)(*local_28 + 0x98))(local_28,in_RSI);
    if ((local_2c < 0) ||
       (bVar1 = ConstFold((Expr *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08), !bVar1)) {
      iVar10 = -1;
    }
    else {
      iVar10 = local_2c * in_stack_ffffffffffffffe8;
    }
    break;
  case 5:
    iVar10 = MinimalHeaderSize(in_RSI,(Env *)CONCAT44(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8));
    break;
  case 8:
    iVar10 = 0;
    if (*(long *)((long)&in_RDI[4].field_2 + 8) != 0) {
      uVar9 = 0;
      while( true ) {
        uVar6 = (ulong)uVar9;
        sVar3 = std::vector<Expr_*,_std::allocator<Expr_*>_>::size
                          (*(vector<Expr_*,_std::allocator<Expr_*>_> **)
                            ((long)&in_RDI[4].field_2 + 8));
        if (sVar3 <= uVar6) break;
        iVar2 = iVar10;
        std::vector<Expr_*,_std::allocator<Expr_*>_>::operator[]
                  (*(vector<Expr_*,_std::allocator<Expr_*>_> **)((long)&in_RDI[4].field_2 + 8),
                   (ulong)uVar9);
        iVar2 = MinimalHeaderSize(in_RSI,(Env *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
        iVar10 = anon_unknown.dwarf_7075e::mhs_max(iVar10,iVar2);
        uVar9 = uVar9 + 1;
      }
    }
    break;
  case 9:
    local_38 = Expr::id(*(Expr **)(in_RDI + 3));
    local_40 = anon_unknown.dwarf_7075e::GetRecordField
                         ((ID *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
    if (local_40 == (RecordField *)0x0) {
      local_48 = TypeDecl::LookUpType(in_stack_ffffffffffffff08);
      if (local_48 == (Type *)0x0) {
        o = (Object *)__cxa_allocate_exception(0x20);
        pcVar5 = local_69;
        __a = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_RDI,pcVar5,(allocator<char> *)__a);
        Exception::Exception((Exception *)__a,o,in_stack_ffffffffffffff20);
        __cxa_throw(o,&Exception::typeinfo,Exception::~Exception);
      }
      iVar10 = 0;
    }
    else {
      iVar10 = (*(local_40->super_Field).super_DataDepElement._vptr_DataDepElement[0xc])
                         (local_40,in_RSI,0xffffffff);
      if (iVar10 < 0) {
        iVar10 = anon_unknown.dwarf_7075e::mhs_recordfield
                           ((Env *)in_stack_ffffffffffffff08,
                            (RecordField *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      else {
        iVar10 = 0;
      }
    }
    break;
  case 10:
    Expr::id(*(Expr **)(in_RDI + 3));
    this_00 = anon_unknown.dwarf_7075e::GetRecordField
                        ((ID *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
    iVar10 = RecordField::static_offset(this_00);
    if (iVar10 < 0) {
      RecordField::prev(this_00);
      iVar10 = anon_unknown.dwarf_7075e::mhs_recordfield
                         ((Env *)in_stack_ffffffffffffff08,
                          (RecordField *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    break;
  case 0x21:
    iVar10 = MinimalHeaderSize(in_RSI,(Env *)CONCAT44(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8));
    uVar9 = 0;
    while( true ) {
      uVar6 = (ulong)uVar9;
      sVar3 = std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::size
                        (*(vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> **)(in_RDI + 5));
      if (sVar3 <= uVar6) break;
      __s = (char *)(ulong)uVar9;
      ppCVar4 = std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::operator[]
                          (*(vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> **)(in_RDI + 5),
                           (size_type)__s);
      this_01 = *ppCVar4;
      pcVar5 = CaseExpr::index(this_01,__s,__c);
      if (pcVar5 != (char *)0x0) {
        local_ac = 0;
        uVar8 = extraout_RDX;
        while( true ) {
          uVar6 = (ulong)local_ac;
          pvVar7 = (vector<Expr_*,_std::allocator<Expr_*>_> *)
                   CaseExpr::index(this_01,__s,(int)uVar8);
          sVar3 = std::vector<Expr_*,_std::allocator<Expr_*>_>::size(pvVar7);
          if (sVar3 <= uVar6) break;
          iVar2 = iVar10;
          pvVar7 = (vector<Expr_*,_std::allocator<Expr_*>_> *)CaseExpr::index(this_01,__s,__c_00);
          std::vector<Expr_*,_std::allocator<Expr_*>_>::operator[](pvVar7,(ulong)local_ac);
          h2 = MinimalHeaderSize(in_RSI,(Env *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
          __s = (char *)(ulong)h2;
          iVar10 = anon_unknown.dwarf_7075e::mhs_max(iVar10,h2);
          local_ac = local_ac + 1;
          uVar8 = extraout_RDX_00;
        }
      }
      iVar2 = iVar10;
      CaseExpr::value(this_01);
      iVar2 = MinimalHeaderSize(in_RSI,(Env *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      iVar10 = anon_unknown.dwarf_7075e::mhs_max(iVar10,iVar2);
      uVar9 = uVar9 + 1;
    }
  }
  return iVar10;
}

Assistant:

int Expr::MinimalHeaderSize(Env* env)
	{
	int mhs;

	switch ( expr_type_ )
		{
		case EXPR_NUM:
			// Zero byte is required
			mhs = 0;
			break;

		case EXPR_ID:
			mhs = mhs_id(env, id_);
			break;

		case EXPR_MEMBER:
			// TODO: this is not a tight bound because
			// one actually does not have to parse the
			// whole record to compute one particular
			// field.
			mhs = operand_[0]->MinimalHeaderSize(env);
			break;

		case EXPR_SUBSCRIPT:
			{
			int index;
			Type* array_type = operand_[0]->DataType(env);
			Type* elem_type = array_type->ElementDataType();
			int elem_size = elem_type->StaticSize(env);
			if ( elem_size >= 0 && operand_[1]->ConstFold(env, &index) )
				{
				mhs = elem_size * index;
				}
			else
				{
				mhs = -1;
				}
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* rf;
			Type* ty;

			if ( (rf = GetRecordField(id, env)) != nullptr )
				{
				if ( rf->StaticSize(env, -1) >= 0 )
					mhs = 0;
				else
					mhs = mhs_recordfield(env, rf);
				}

			else if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
				{
				mhs = 0;
				}

			else
				throw Exception(id, "not a record field or type");
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* field = GetRecordField(id, env);

			mhs = field->static_offset();
			if ( mhs < 0 )
				{
				mhs = 0;
				// Take the MHS of the preceding (non-let) field
				RecordField* prev_field = field->prev();
				ASSERT(prev_field);
				mhs = mhs_recordfield(env, prev_field);
				}
			}
			break;

		case EXPR_CALLARGS:
			{
			mhs = 0;
			if ( args_ )
				for ( unsigned int i = 0; i < args_->size(); ++i )
					mhs = mhs_max(mhs, (*args_)[i]->MinimalHeaderSize(env));
			}
			break;
		case EXPR_CASE:
			{
			mhs = operand_[0]->MinimalHeaderSize(env);
			for ( unsigned int i = 0; i < cases_->size(); ++i )
				{
				CaseExpr* ce = (*cases_)[i];
				if ( ce->index() )
					for ( unsigned int j = 0; j < ce->index()->size(); ++j )
						mhs = mhs_max(mhs, (*ce->index())[j]->MinimalHeaderSize(env));
				mhs = mhs_max(mhs, ce->value()->MinimalHeaderSize(env));
				}
			}
			break;
		default:
			// Evaluate every operand by default
			mhs = 0;
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					mhs = mhs_max(mhs, operand_[i]->MinimalHeaderSize(env));
			break;
		}

	return mhs;
	}